

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnodewalk.h
# Opt level: O3

ResultType __thiscall
ParseNodeWalker<WalkerPolicyTest>::WalkFnc
          (ParseNodeWalker<WalkerPolicyTest> *this,ParseNodeFnc *pnode,Context context)

{
  bool bVar1;
  int iVar2;
  ParseNodeParamPattern *pPVar3;
  ParseNodeVar *pPVar4;
  ParseNodePtr *ppPVar5;
  ParseNodePtr this_00;
  
  this_00 = pnode->pnodeParams;
  while (this_00 != (ParseNode *)0x0) {
    iVar2 = (**(this->super_WalkerPolicyTest).
               super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
               _vptr_WalkerPolicyBase)(this,this_00,context);
    bVar1 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (!bVar1) {
      return (ResultType)(char)iVar2;
    }
    if (this_00->nop == knopParamPattern) {
      pPVar3 = ParseNode::AsParseNodeParamPattern(this_00);
      ppPVar5 = &pPVar3->pnodeNext;
    }
    else {
      pPVar4 = ParseNode::AsParseNodeVar(this_00);
      ppPVar5 = &pPVar4->pnodeNext;
    }
    this_00 = *ppPVar5;
  }
  if (pnode->pnodeRest != (ParseNodePtr)0x0) {
    iVar2 = (**(this->super_WalkerPolicyTest).
               super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
               _vptr_WalkerPolicyBase)(this,pnode->pnodeRest,context);
    bVar1 = ThreadContext::IsCurrentStackAvailable(0x2400);
    if (!bVar1) {
      return (ResultType)(char)iVar2;
    }
  }
  bVar1 = ThreadContext::IsCurrentStackAvailable(0x2400);
  if (!bVar1) {
    return true;
  }
  iVar2 = (**(this->super_WalkerPolicyTest).
             super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
             _vptr_WalkerPolicyBase)(this,pnode->pnodeBody,context);
  return SUB41(iVar2,0);
}

Assistant:

ResultType WalkFnc(ParseNodeFnc *pnode, Context context)
    {
        ResultType result;
        // For ordering, arguments are considered prior to the function and the body after.
        ParseNodePtr argNode = pnode->pnodeParams;
        while (argNode)
        {
            result = argNode == pnode->pnodeParams ? WalkFirstChild(argNode, context) : WalkNthChild(pnode, argNode, context);
            if (!ContinueWalk(result)) return result;
            if (argNode->nop == knopParamPattern)
            {
                argNode = argNode->AsParseNodeParamPattern()->pnodeNext;
            }
            else
            {
                argNode = argNode->AsParseNodeVar()->pnodeNext;
            }
        }

        if (pnode->pnodeRest != nullptr)
        {
            result = WalkSecondChild(pnode->pnodeRest, context);
            if (!ContinueWalk(result))  return result;
        }

        result = WalkNode(pnode, context);
        if (ContinueWalk(result)) result = WalkNthChild(pnode, pnode->pnodeBody, context);
        return result;
    }